

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

int cpolyroot(double *rcoeff,double *icoeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  size_t __size;
  int iVar1;
  double *OPR;
  double *OPI;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)DEGREE;
  __size = lVar4 * 8 + 8;
  OPR = (double *)malloc(__size);
  OPI = (double *)malloc(__size);
  lVar3 = lVar4;
  for (lVar2 = 0; lVar2 <= lVar4; lVar2 = lVar2 + 1) {
    OPR[lVar2] = rcoeff[lVar3];
    OPI[lVar2] = icoeff[lVar3];
    lVar3 = lVar3 + -1;
  }
  iVar1 = cpoly(OPR,OPI,DEGREE,ZEROR,ZEROI);
  free(OPR);
  free(OPI);
  return iVar1;
}

Assistant:

int cpolyroot(double *rcoeff,double *icoeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - rcoeff[0]+i*icoeff[0] + (rcoeff[1] + i*icoeff[1]) * x^1 + (rcoeff[2] + i*icoeff[2]) * x^2 + ---- + (rcoeff[DEGREE+1] + i*icoeff[DEGREE+1]) * x^DEGREE

	The program fails if there are leading zeros [At least one coefficient of the highest degree should be non-zero. Reduce degree by one if both are zero]. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail, i, N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = rcoeff[N - 1 - i];
		OPI[i] = icoeff[N - 1 - i];
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}